

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::Get(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest,SQUnsignedInteger getflags
         ,SQInteger selfidx)

{
  SQObjectType SVar1;
  long lVar2;
  _HashNode *p_Var3;
  bool bVar4;
  SQInteger SVar5;
  long local_80;
  SQInteger local_78;
  SQWeakRef *w;
  SQInteger len;
  SQInteger n;
  SQInteger selfidx_local;
  SQUnsignedInteger getflags_local;
  SQObjectPtr *dest_local;
  SQObjectPtr *key_local;
  SQObjectPtr *self_local;
  SQVM *this_local;
  
  SVar1 = (self->super_SQObject)._type;
  if (SVar1 == OT_STRING) {
    if (((key->super_SQObject)._type & 0x4000000) != 0) {
      if ((key->super_SQObject)._type == OT_FLOAT) {
        local_80 = (long)(key->super_SQObject)._unVal.fFloat;
      }
      else {
        local_80 = (key->super_SQObject)._unVal.nInteger;
      }
      len = local_80;
      lVar2 = ((self->super_SQObject)._unVal.pString)->_len;
      if (local_80 < 0) {
        len = lVar2 + local_80;
      }
      if ((-1 < len) && (len < lVar2)) {
        ::SQObjectPtr::operator=
                  (dest,(long)*(char *)((long)&((self->super_SQObject)._unVal.pTable)->_firstfree +
                                       len));
        return true;
      }
      if ((getflags & 2) == 0) {
        Raise_IdxError(this,key);
      }
      return false;
    }
  }
  else if (SVar1 == OT_ARRAY) {
    if (((key->super_SQObject)._type & 0x4000000) != 0) {
      if ((key->super_SQObject)._type == OT_FLOAT) {
        local_78 = (SQInteger)(key->super_SQObject)._unVal.fFloat;
      }
      else {
        local_78 = (key->super_SQObject)._unVal.nInteger;
      }
      bVar4 = SQArray::Get((self->super_SQObject)._unVal.pArray,local_78,dest);
      if (!bVar4) {
        if ((getflags & 2) == 0) {
          Raise_IdxError(this,key);
        }
        return false;
      }
      return true;
    }
  }
  else if (SVar1 == OT_CLASS) {
    bVar4 = SQClass::Get((self->super_SQObject)._unVal.pClass,key,dest);
    if (bVar4) {
      return true;
    }
  }
  else if (SVar1 == OT_TABLE) {
    bVar4 = SQTable::Get((self->super_SQObject)._unVal.pTable,key,dest);
    if (bVar4) {
      return true;
    }
  }
  else if ((SVar1 == OT_INSTANCE) &&
          (bVar4 = SQInstance::Get((self->super_SQObject)._unVal.pInstance,key,dest), bVar4)) {
    return true;
  }
  if ((getflags & 1) == 0) {
    SVar5 = FallBackGet(this,self,key,dest);
    if (SVar5 == 0) {
      return true;
    }
    if ((SVar5 != 1) && (SVar5 == 2)) {
      return false;
    }
    bVar4 = InvokeDefaultDelegate(this,self,key,dest);
    if (bVar4) {
      return true;
    }
  }
  if (((selfidx == 0) &&
      (p_Var3 = ((this->ci->_closure).super_SQObject._unVal.pTable)->_firstfree,
      (p_Var3->key).super_SQObject._unVal.fFloat != 2.350989e-38)) &&
     (bVar4 = Get(this,(SQObjectPtr *)&(p_Var3->key).super_SQObject._unVal,key,dest,0,0x29a), bVar4)
     ) {
    this_local._7_1_ = true;
  }
  else {
    if ((getflags & 2) == 0) {
      Raise_IdxError(this,key);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQVM::Get(const SQObjectPtr &self, const SQObjectPtr &key, SQObjectPtr &dest, SQUnsignedInteger getflags, SQInteger selfidx)
{
    switch(type(self)){
    case OT_TABLE:
        if(_table(self)->Get(key,dest))return true;
        break;
    case OT_ARRAY:
        if (sq_isnumeric(key)) { if (_array(self)->Get(tointeger(key), dest)) { return true; } if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key); return false; }
        break;
    case OT_INSTANCE:
        if(_instance(self)->Get(key,dest)) return true;
        break;
    case OT_CLASS:
        if(_class(self)->Get(key,dest)) return true;
        break;
    case OT_STRING:
        if(sq_isnumeric(key)){
            SQInteger n = tointeger(key);
            SQInteger len = _string(self)->_len;
            if (n < 0) { n += len; }
            if (n >= 0 && n < len) {
                dest = SQInteger(_stringval(self)[n]);
                return true;
            }
            if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key);
            return false;
        }
        break;
    default:break; //shut up compiler
    }
    if ((getflags & GET_FLAG_RAW) == 0) {
        switch(FallBackGet(self,key,dest)) {
            case FALLBACK_OK: return true; //okie
            case FALLBACK_NO_MATCH: break; //keep falling back
            case FALLBACK_ERROR: return false; // the metamethod failed
        }
        if(InvokeDefaultDelegate(self,key,dest)) {
            return true;
        }
    }
//#ifdef ROOT_FALLBACK
    if(selfidx == 0) {
        SQWeakRef *w = _closure(ci->_closure)->_root;
        if(type(w->_obj) != OT_NULL)
        {
            if(Get(*((const SQObjectPtr *)&w->_obj),key,dest,0,DONT_FALL_BACK)) return true;
        }

    }
//#endif
    if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key);
    return false;
}